

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void vu_ft1(t_vu *x,t_floatarg peak)

{
  int iVar1;
  float f;
  int iVar2;
  
  iVar1 = x->x_peak;
  iVar2 = 0;
  if (-99.9 < peak) {
    if (12.0 <= peak) {
      iVar2 = 0x28;
    }
    else {
      iVar2 = iemgui_vu_db2i[(int)(peak + 100.0 + peak + 100.0)];
    }
  }
  f = (float)((int)(peak * 100.0 + 10000.5) + -10000) * 0.01;
  x->x_peak = iVar2;
  x->x_fp = f;
  x->field_0x4b8 = x->field_0x4b8 | 2;
  if (iVar2 != iVar1) {
    sys_queuegui(x,(x->x_gui).x_glist,vu_draw_update);
  }
  outlet_float((_outlet *)x->x_out_peak,f);
  return;
}

Assistant:

static void vu_ft1(t_vu *x, t_floatarg peak)
{
    int i;
    int old = x->x_peak;
    if(peak <= IEM_VU_MINDB)
        x->x_peak = 0;
    else if(peak >= IEM_VU_MAXDB)
        x->x_peak = IEM_VU_STEPS;
    else
    {
        int i = (int)(2.0*(peak + IEM_VU_OFFSET));
        x->x_peak = iemgui_vu_db2i[i];
    }
    i = (int)(100.0*peak + 10000.5);
    peak = 0.01*(t_float)(i - 10000);
    x->x_fp = peak;
    x->x_updatepeak = 1;
    if(x->x_peak != old)
        sys_queuegui(x, x->x_gui.x_glist, vu_draw_update);
    outlet_float(x->x_out_peak, peak);
}